

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ClampedReLULayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_clampedrelu(NeuralNetworkLayer *this)

{
  bool bVar1;
  ClampedReLULayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_clampedrelu(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_clampedrelu(this);
    this_00 = (ClampedReLULayerParams *)operator_new(0x20);
    ClampedReLULayerParams::ClampedReLULayerParams(this_00);
    (this->layer_).clampedrelu_ = this_00;
  }
  return (ClampedReLULayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ClampedReLULayerParams* NeuralNetworkLayer::mutable_clampedrelu() {
  if (!has_clampedrelu()) {
    clear_layer();
    set_has_clampedrelu();
    layer_.clampedrelu_ = new ::CoreML::Specification::ClampedReLULayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.clampedReLU)
  return layer_.clampedrelu_;
}